

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding.c
# Opt level: O1

int xmlCreateCharEncodingHandler
              (char *name,int output,xmlCharEncConvImpl impl,void *implCtxt,
              xmlCharEncodingHandler **out)

{
  int iVar1;
  char *name_00;
  void *pvVar2;
  uint uVar3;
  
  iVar1 = 0x73;
  if ((out != (xmlCharEncodingHandler **)0x0) &&
     (*out = (xmlCharEncodingHandler *)0x0, name != (char *)0x0)) {
    name_00 = xmlGetEncodingAlias(name);
    if (name_00 == (char *)0x0) {
      name_00 = name;
    }
    pvVar2 = bsearch(name_00,xmlEncTable,0x25,0x10,xmlCompareEncTableEntries);
    if (pvVar2 == (void *)0x0) {
      uVar3 = 0xffffffff;
    }
    else {
      uVar3 = *(uint *)((long)pvVar2 + 8);
    }
    iVar1 = 0;
    if (uVar3 != 1) {
      if ((0x1d < uVar3 - 1) ||
         (*(long *)((ulong)uVar3 * 0x48 + 0x210a58 + (ulong)(output != 0) * 8) == 0)) {
        iVar1 = xmlFindExtraHandler(name,name_00,output,impl,implCtxt,out);
        return iVar1;
      }
      *out = defaultHandlers + uVar3;
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int
xmlCreateCharEncodingHandler(const char *name, int output,
                             xmlCharEncConvImpl impl, void *implCtxt,
                             xmlCharEncodingHandler **out) {
    const xmlCharEncodingHandler *handler;
    const char *norig, *nalias;
    xmlCharEncoding enc;

    if (out == NULL)
        return(XML_ERR_ARGUMENT);
    *out = NULL;

    if (name == NULL)
        return(XML_ERR_ARGUMENT);

    norig = name;
    nalias = xmlGetEncodingAlias(name);
    if (nalias != NULL)
	name = nalias;

    enc = xmlParseCharEncodingInternal(name);

    /* Return NULL handler for UTF-8 */
    if (enc == XML_CHAR_ENCODING_UTF8)
        return(XML_ERR_OK);

    if ((enc > 0) && ((size_t) enc < NUM_DEFAULT_HANDLERS)) {
        handler = &defaultHandlers[enc];
        if ((output ? handler->output : handler->input) != NULL) {
            *out = (xmlCharEncodingHandler *) handler;
            return(XML_ERR_OK);
        }
    }

    return(xmlFindExtraHandler(norig, name, output, impl, implCtxt, out));
}